

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&>
                  *this,vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        *container,MatchResultListener *listener)

{
  undefined1 *this_00;
  bool bVar1;
  const_reference this_01;
  const_iterator elem_first;
  const_iterator elem_last;
  bool local_9a;
  undefined1 local_68 [8];
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  StlContainerReference stl_container;
  MatchResultListener *listener_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *container_local;
  UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&>
  *this_local;
  
  this_01 = StlContainerView<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::ConstReference(container);
  this_00 = &matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  elem_first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (this_01);
  elem_last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_01);
  UnorderedElementsAreMatcherImpl<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>const&>
  ::
  AnalyzeElements<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            ((MatchMatrix *)local_68,
             (UnorderedElementsAreMatcherImpl<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>const&>
              *)this,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      )elem_first._M_current,
             (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )elem_last._M_current,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00,listener);
  bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,(MatchMatrix *)local_68,listener);
  local_9a = false;
  if (bVar1) {
    local_9a = UnorderedElementsAreMatcherImplBase::FindPairing
                         (&this->super_UnorderedElementsAreMatcherImplBase,(MatchMatrix *)local_68,
                          listener);
  }
  MatchMatrix::~MatchMatrix((MatchMatrix *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return local_9a;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }